

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::ktx_texture::write_to_stream
          (ktx_texture *this,data_stream_serializer *serializer,bool no_keyvalue_data)

{
  uint32 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ssize_t sVar7;
  byte bVar8;
  uint uVar9;
  uint zslice;
  int iVar10;
  long lVar11;
  uint face;
  int iVar12;
  uint uVar13;
  uint32 uVar14;
  uint uVar15;
  uint uVar16;
  uint array_element;
  vector<unsigned_char> *pvVar17;
  uint i;
  ulong uVar18;
  uint32 image_size;
  uint8 padding [3];
  uint8_vec tmp_image_data;
  
  bVar2 = consistency_check(this);
  if (bVar2) {
    (this->m_header).m_identifier[0] = 0xab;
    (this->m_header).m_identifier[1] = 'K';
    (this->m_header).m_identifier[2] = 'T';
    (this->m_header).m_identifier[3] = 'X';
    (this->m_header).m_identifier[4] = ' ';
    (this->m_header).m_identifier[5] = '1';
    (this->m_header).m_identifier[6] = '1';
    (this->m_header).m_identifier[7] = 0xbb;
    (this->m_header).m_identifier[8] = '\r';
    (this->m_header).m_identifier[9] = '\n';
    (this->m_header).m_identifier[10] = '\x1a';
    (this->m_header).m_identifier[0xb] = '\n';
    bVar2 = this->m_opposite_endianness;
    uVar14 = 0x4030201;
    if (bVar2 != false) {
      uVar14 = 0x1020304;
    }
    (this->m_header).m_endianness = uVar14;
    if (this->m_block_dim == 1) {
      uVar3 = get_ogl_type_size((this->m_header).m_glType);
      (this->m_header).m_glTypeSize = uVar3;
      uVar14 = (this->m_header).m_glFormat;
    }
    else {
      uVar14 = get_ogl_base_internal_fmt((this->m_header).m_glInternalFormat);
    }
    (this->m_header).m_glBaseInternalFormat = uVar14;
    (this->m_header).m_bytesOfKeyValueData = 0;
    if (!no_keyvalue_data) {
      uVar4 = (this->m_key_values).m_size;
      pvVar17 = (this->m_key_values).m_p;
      uVar14 = 0;
      for (lVar11 = 0; (ulong)uVar4 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
        uVar14 = uVar14 + (*(int *)((long)&pvVar17->m_size + lVar11) + 3U & 0xfffffffc) + 4;
        (this->m_header).m_bytesOfKeyValueData = uVar14;
      }
    }
    if (bVar2 != false) {
      ktx_header::endian_swap(&this->m_header);
    }
    uVar4 = (*serializer->m_pStream->_vptr_data_stream[6])(serializer->m_pStream,this,0x40);
    if (this->m_opposite_endianness == true) {
      ktx_header::endian_swap(&this->m_header);
    }
    if ((uVar4 & 0xffffffc0) == 0x40) {
      padding[2] = '\0';
      padding[0] = '\0';
      padding[1] = '\0';
      if (!no_keyvalue_data) {
        lVar11 = 0;
        for (uVar18 = 0; uVar18 < (this->m_key_values).m_size; uVar18 = uVar18 + 1) {
          tmp_image_data.m_p._0_4_ = *(uint *)((long)&((this->m_key_values).m_p)->m_size + lVar11);
          if (this->m_opposite_endianness == true) {
            tmp_image_data.m_p._0_4_ =
                 (uint)tmp_image_data.m_p >> 0x18 | ((uint)tmp_image_data.m_p & 0xff0000) >> 8 |
                 ((uint)tmp_image_data.m_p & 0xff00) << 8 | (uint)tmp_image_data.m_p << 0x18;
          }
          uVar4 = (*serializer->m_pStream->_vptr_data_stream[6])
                            (serializer->m_pStream,&tmp_image_data,4);
          if (this->m_opposite_endianness == true) {
            tmp_image_data.m_p._0_4_ =
                 (uint)tmp_image_data.m_p >> 0x18 | ((uint)tmp_image_data.m_p & 0xff0000) >> 8 |
                 ((uint)tmp_image_data.m_p & 0xff00) << 8 | (uint)tmp_image_data.m_p << 0x18;
          }
          if ((uVar4 & 0xfffffffc) != 4) {
            return false;
          }
          if ((uint)tmp_image_data.m_p != 0) {
            sVar7 = data_stream_serializer::write
                              (serializer,
                               (int)*(undefined8 *)((long)&((this->m_key_values).m_p)->m_p + lVar11)
                               ,(void *)(ulong)(uint)tmp_image_data.m_p,1);
            if ((int)sVar7 != 1) {
              return false;
            }
            uVar4 = (uint)tmp_image_data.m_p - 1 & 3;
            if ((uVar4 != 3) &&
               (sVar7 = data_stream_serializer::write
                                  (serializer,(int)padding,(void *)(ulong)(uVar4 ^ 3),1),
               (int)sVar7 != 1)) {
              return false;
            }
          }
          lVar11 = lVar11 + 0x10;
        }
      }
      uVar4 = 0;
      while( true ) {
        uVar14 = (this->m_header).m_numberOfMipmapLevels;
        bVar2 = uVar14 + (uVar14 == 0) <= uVar4;
        if (bVar2) {
          return bVar2;
        }
        bVar8 = (byte)uVar4;
        uVar9 = (this->m_header).m_pixelWidth >> (bVar8 & 0x1f);
        uVar14 = (this->m_header).m_pixelHeight;
        uVar13 = uVar14 + (uVar14 == 0) >> (bVar8 & 0x1f);
        uVar14 = (this->m_header).m_pixelDepth;
        uVar15 = uVar14 + (uVar14 == 0);
        uVar16 = uVar15 >> (bVar8 & 0x1f);
        uVar5 = this->m_block_dim;
        uVar9 = (uVar5 + uVar9 + (uVar9 == 0)) - 1;
        if (uVar9 < uVar5) {
          return bVar2;
        }
        uVar13 = (uVar5 + uVar13 + (uVar13 == 0)) - 1;
        if (uVar13 < uVar5) {
          return bVar2;
        }
        image_size = (uVar9 / uVar5) * (uVar13 / uVar5) * this->m_bytes_per_block;
        uVar14 = (this->m_header).m_numberOfArrayElements;
        uVar1 = (this->m_header).m_numberOfFaces;
        if (uVar1 == 1 || uVar14 != 0) {
          image_size = image_size * uVar15 * (uVar14 + (uVar14 == 0)) * uVar1;
        }
        if (image_size == 0) break;
        if (this->m_opposite_endianness == true) {
          image_size = image_size >> 0x18 | (image_size & 0xff0000) >> 8 |
                       (image_size & 0xff00) << 8 | image_size << 0x18;
        }
        uVar5 = (*serializer->m_pStream->_vptr_data_stream[6])(serializer->m_pStream,&image_size,4);
        if (this->m_opposite_endianness == true) {
          image_size = image_size >> 0x18 | (image_size & 0xff0000) >> 8 |
                       (image_size & 0xff00) << 8 | image_size << 0x18;
        }
        if ((uVar5 & 0xfffffffc) != 4) {
          return false;
        }
        uVar14 = (this->m_header).m_numberOfArrayElements;
        uVar5 = (this->m_header).m_numberOfFaces;
        if (uVar5 == 6 && uVar14 == 0) {
          uVar5 = 6;
          for (uVar9 = 0; uVar9 < uVar5; uVar9 = uVar9 + 1) {
            uVar14 = (this->m_header).m_pixelDepth;
            uVar1 = (this->m_header).m_numberOfArrayElements;
            uVar13 = (uVar5 * uVar4 * (uVar1 + (uVar1 == 0)) + uVar9) * (uVar14 + (uVar14 == 0));
            pvVar17 = (this->m_image_data).m_p;
            uVar5 = pvVar17[uVar13].m_size;
            if (uVar5 == 0) {
              return false;
            }
            if (uVar5 != image_size) {
              return false;
            }
            pvVar17 = pvVar17 + uVar13;
            if (this->m_opposite_endianness == true) {
              vector<unsigned_char>::vector(&tmp_image_data,pvVar17);
              utils::endian_swap_mem
                        ((void *)CONCAT44(tmp_image_data.m_p._4_4_,(uint)tmp_image_data.m_p),
                         tmp_image_data.m_size,(this->m_header).m_glTypeSize);
              sVar7 = data_stream_serializer::write
                                (serializer,(uint)tmp_image_data.m_p,
                                 (void *)(ulong)tmp_image_data.m_size,1);
              vector<unsigned_char>::~vector(&tmp_image_data);
              iVar12 = (int)sVar7;
            }
            else {
              sVar7 = data_stream_serializer::write
                                (serializer,(int)pvVar17->m_p,(void *)(ulong)uVar5,1);
              iVar12 = (int)sVar7;
            }
            if (iVar12 != 1) {
              return false;
            }
            uVar5 = pvVar17->m_size - 1 & 3;
            if ((uVar5 != 3) &&
               (sVar7 = data_stream_serializer::write
                                  (serializer,(int)padding,(void *)(ulong)(uVar5 ^ 3),1),
               (int)sVar7 != 1)) {
              return false;
            }
            uVar5 = (this->m_header).m_numberOfFaces;
          }
        }
        else {
          iVar12 = 0;
          for (uVar9 = 0; uVar9 < uVar14 + (uVar14 == 0); uVar9 = uVar9 + 1) {
            for (uVar13 = 0; uVar13 < uVar5; uVar13 = uVar13 + 1) {
              for (iVar10 = 0; uVar16 + (uVar16 == 0) != iVar10; iVar10 = iVar10 + 1) {
                uVar14 = (this->m_header).m_pixelDepth;
                uVar1 = (this->m_header).m_numberOfArrayElements;
                uVar15 = (((uVar1 + (uVar1 == 0)) * uVar4 + uVar9) *
                          (this->m_header).m_numberOfFaces + uVar13) * (uVar14 + (uVar14 == 0)) +
                         iVar10;
                pvVar17 = (this->m_image_data).m_p;
                uVar5 = pvVar17[uVar15].m_size;
                if (uVar5 == 0) {
                  return false;
                }
                pvVar17 = pvVar17 + uVar15;
                if (this->m_opposite_endianness == true) {
                  vector<unsigned_char>::vector(&tmp_image_data,pvVar17);
                  utils::endian_swap_mem
                            ((void *)CONCAT44(tmp_image_data.m_p._4_4_,(uint)tmp_image_data.m_p),
                             tmp_image_data.m_size,(this->m_header).m_glTypeSize);
                  sVar7 = data_stream_serializer::write
                                    (serializer,(uint)tmp_image_data.m_p,
                                     (void *)(ulong)tmp_image_data.m_size,1);
                  vector<unsigned_char>::~vector(&tmp_image_data);
                  iVar6 = (int)sVar7;
                }
                else {
                  sVar7 = data_stream_serializer::write
                                    (serializer,(int)pvVar17->m_p,(void *)(ulong)uVar5,1);
                  iVar6 = (int)sVar7;
                }
                if (iVar6 != 1) {
                  return false;
                }
                iVar12 = iVar12 + pvVar17->m_size;
              }
              uVar5 = (this->m_header).m_numberOfFaces;
            }
            uVar14 = (this->m_header).m_numberOfArrayElements;
          }
          uVar5 = iVar12 - 1U & 3;
          if ((uVar5 != 3) &&
             (sVar7 = data_stream_serializer::write
                                (serializer,(int)padding,(void *)(ulong)(uVar5 ^ 3),1),
             (int)sVar7 != 1)) {
            return false;
          }
        }
        uVar4 = uVar4 + 1;
      }
    }
  }
  return false;
}

Assistant:

bool ktx_texture::write_to_stream(data_stream_serializer& serializer, bool no_keyvalue_data) {
  if (!consistency_check()) {
    CRNLIB_ASSERT(0);
    return false;
  }

  memcpy(m_header.m_identifier, s_ktx_file_id, sizeof(m_header.m_identifier));
  m_header.m_endianness = m_opposite_endianness ? KTX_OPPOSITE_ENDIAN : KTX_ENDIAN;

  if (m_block_dim == 1) {
    m_header.m_glTypeSize = get_ogl_type_size(m_header.m_glType);
    m_header.m_glBaseInternalFormat = m_header.m_glFormat;
  } else {
    m_header.m_glBaseInternalFormat = get_ogl_base_internal_fmt(m_header.m_glInternalFormat);
  }

  m_header.m_bytesOfKeyValueData = 0;
  if (!no_keyvalue_data) {
    for (uint i = 0; i < m_key_values.size(); i++)
      m_header.m_bytesOfKeyValueData += sizeof(uint32) + ((m_key_values[i].size() + 3) & ~3);
  }

  if (m_opposite_endianness)
    m_header.endian_swap();

  bool success = (serializer.write(&m_header, sizeof(m_header), 1) == 1);

  if (m_opposite_endianness)
    m_header.endian_swap();

  if (!success)
    return success;

  uint total_key_value_bytes = 0;
  const uint8 padding[3] = {0, 0, 0};

  if (!no_keyvalue_data) {
    for (uint i = 0; i < m_key_values.size(); i++) {
      uint32 key_value_size = m_key_values[i].size();

      if (m_opposite_endianness)
        key_value_size = utils::swap32(key_value_size);

      success = (serializer.write(&key_value_size, sizeof(key_value_size), 1) == 1);
      total_key_value_bytes += sizeof(key_value_size);

      if (m_opposite_endianness)
        key_value_size = utils::swap32(key_value_size);

      if (!success)
        return false;

      if (key_value_size) {
        if (serializer.write(&m_key_values[i][0], key_value_size, 1) != 1)
          return false;
        total_key_value_bytes += key_value_size;

        uint num_padding = 3 - ((key_value_size + 3) % 4);
        if ((num_padding) && (serializer.write(padding, num_padding, 1) != 1))
          return false;
        total_key_value_bytes += num_padding;
      }
    }
    (void)total_key_value_bytes;
  }

  CRNLIB_ASSERT(total_key_value_bytes == m_header.m_bytesOfKeyValueData);

  for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++) {
    uint mip_width, mip_height, mip_depth;
    get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

    const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
    const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
    if ((!mip_row_blocks) || (!mip_col_blocks))
      return false;

    uint32 image_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
    if ((m_header.m_numberOfArrayElements) || (get_num_faces() == 1))
      image_size *= (get_array_size() * get_num_faces() * get_depth());

    if (!image_size)
      return false;

    if (m_opposite_endianness)
      image_size = utils::swap32(image_size);

    success = (serializer.write(&image_size, sizeof(image_size), 1) == 1);

    if (m_opposite_endianness)
      image_size = utils::swap32(image_size);

    if (!success)
      return false;

    uint total_mip_size = 0;

    if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6)) {
      // plain non-array cubemap
      for (uint face = 0; face < get_num_faces(); face++) {
        const uint8_vec& image_data = get_image_data(get_image_index(mip_level, 0, face, 0));
        if ((!image_data.size()) || (image_data.size() != image_size))
          return false;

        if (m_opposite_endianness) {
          uint8_vec tmp_image_data(image_data);
          utils::endian_swap_mem(&tmp_image_data[0], tmp_image_data.size(), m_header.m_glTypeSize);
          if (serializer.write(&tmp_image_data[0], tmp_image_data.size(), 1) != 1)
            return false;
        } else if (serializer.write(&image_data[0], image_data.size(), 1) != 1)
          return false;

        uint num_cube_pad_bytes = 3 - ((image_data.size() + 3) % 4);
        if ((num_cube_pad_bytes) && (serializer.write(padding, num_cube_pad_bytes, 1) != 1))
          return false;

        total_mip_size += image_size + num_cube_pad_bytes;
      }
    } else {
      // 1D, 2D, 3D (normal or array texture), or array cubemap
      for (uint array_element = 0; array_element < get_array_size(); array_element++) {
        for (uint face = 0; face < get_num_faces(); face++) {
          for (uint zslice = 0; zslice < mip_depth; zslice++) {
            const uint8_vec& image_data = get_image_data(get_image_index(mip_level, array_element, face, zslice));
            if (!image_data.size())
              return false;

            if (m_opposite_endianness) {
              uint8_vec tmp_image_data(image_data);
              utils::endian_swap_mem(&tmp_image_data[0], tmp_image_data.size(), m_header.m_glTypeSize);
              if (serializer.write(&tmp_image_data[0], tmp_image_data.size(), 1) != 1)
                return false;
            } else if (serializer.write(&image_data[0], image_data.size(), 1) != 1)
              return false;

            total_mip_size += image_data.size();
          }
        }
      }

      uint num_mip_pad_bytes = 3 - ((total_mip_size + 3) % 4);
      if ((num_mip_pad_bytes) && (serializer.write(padding, num_mip_pad_bytes, 1) != 1))
        return false;
      total_mip_size += num_mip_pad_bytes;
    }
    CRNLIB_ASSERT((total_mip_size & 3) == 0);
  }

  return true;
}